

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_> *
kj::parse::
Many_<kj::parse::Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>,_false>
::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>
::apply(Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>
        *__return_storage_ptr__,
       Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
       *subParser,IteratorInput<char,_const_char_*> *input)

{
  bool bVar1;
  NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *other;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar2;
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> local_108;
  int local_ec;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *local_e8;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *subResult;
  undefined1 local_a8 [8];
  NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> _subResult425;
  IteratorInput<char,_const_char_*> subInput;
  undefined1 local_40 [8];
  Results results;
  IteratorInput<char,_const_char_*> *input_local;
  Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
  *subParser_local;
  
  results.builder.disposer = (ArrayDisposer *)input;
  Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::Vector
            ((Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)local_40);
  do {
    bVar1 = IteratorInput<char,_const_char_*>::atEnd
                      ((IteratorInput<char,_const_char_*> *)results.builder.disposer);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    IteratorInput<char,_const_char_*>::IteratorInput
              ((IteratorInput<char,_const_char_*> *)
               &_subResult425.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.
                value.disposer,(IteratorInput<char,_const_char_*> *)results.builder.disposer);
    Sequence_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>,_kj::parse::OneOf_<const_kj::parse::EndOfInput__&,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'.'>,_kj::parse::NotLookingAt_<const_kj::parse::EndOfInput__&>_>_>_>
    ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>
              ((Maybe<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)&subResult,subParser,
               (IteratorInput<char,_const_char_*> *)
               &_subResult425.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.
                value.disposer);
    other = kj::_::readMaybe<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>
                      ((Maybe<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)&subResult);
    kj::_::NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::NullableValue
              ((NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)local_a8,other
              );
    Maybe<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Maybe
              ((Maybe<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)&subResult);
    pTVar2 = kj::_::NullableValue::operator_cast_to_Tuple_((NullableValue *)local_a8);
    if (pTVar2 == (Tuple<kj::String,_kj::Array<unsigned_long>_> *)0x0) {
      local_ec = 3;
    }
    else {
      local_e8 = kj::_::NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::
                 operator*((NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)
                           local_a8);
      IteratorInput<char,_const_char_*>::advanceParent
                ((IteratorInput<char,_const_char_*> *)
                 &_subResult425.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>
                  .value.disposer);
      pTVar2 = mv<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>(local_e8);
      Vector<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>::
      add<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>
                ((Vector<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>> *)local_40,pTVar2);
      local_ec = 0;
    }
    kj::_::NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~NullableValue
              ((NullableValue<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)local_a8);
    if (local_ec == 0) {
      local_ec = 0;
    }
    IteratorInput<char,_const_char_*>::~IteratorInput
              ((IteratorInput<char,_const_char_*> *)
               &_subResult425.field_1.value.impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.
                value.disposer);
  } while (local_ec == 0);
  Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::releaseAsArray
            (&local_108,(Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)local_40);
  Maybe<kj::Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>_>::Maybe
            (__return_storage_ptr__,&local_108);
  Array<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Array(&local_108);
  local_ec = 1;
  Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::~Vector
            ((Vector<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }